

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O2

void __thiscall PluginFverb::setParameterValue(PluginFverb *this,uint32_t index,float value)

{
  LinearSmoother *this_00;
  
  if (0xe < index) {
    d_safe_assert("index < kNumParameters",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
                  ,0xb2);
    return;
  }
  if (index == 0xe) {
    this->fVintage = 0.5 <= value;
    return;
  }
  if (index == 0xc) {
    this_00 = &this->fDry;
  }
  else {
    if (index != 0xd) {
      if (index == 0) {
        this->fBypass = value;
        return;
      }
      if (index - 1 < 0xb) {
        Fverb::set_parameter
                  ((this->fDsp)._M_t.super___uniq_ptr_impl<Fverb,_std::default_delete<Fverb>_>._M_t.
                   super__Tuple_impl<0UL,_Fverb_*,_std::default_delete<Fverb>_>.
                   super__Head_base<0UL,_Fverb_*,_false>._M_head_impl,index - 1,value);
        return;
      }
      d_safe_assert("index >= pIdDspFirst && index <= pIdDspLast",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
                    ,0xc3);
      return;
    }
    this_00 = &this->fWet;
  }
  LinearSmoother::setTarget(this_00,value / 100.0);
  return;
}

Assistant:

void PluginFverb::setParameterValue(uint32_t index, float value)
{
    DISTRHO_SAFE_ASSERT_RETURN(index < kNumParameters, );

    switch (index) {
    case pIdBypass:
        fBypass = value;
        return;
    case pIdDry:
        fDry.setTarget(value / 100);
        return;
    case pIdWet:
        fWet.setTarget(value / 100);
        return;
    case pIdVintage:
        fVintage = value >= 0.5f;
        return;
    }

    DISTRHO_SAFE_ASSERT_RETURN(index >= pIdDspFirst && index <= pIdDspLast, );
    index -= pIdDspFirst;

    fDsp->set_parameter(index, value);
}